

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::repaintOldAndNewSelection
          (QWidgetTextControlPrivate *this,QTextCursor *oldSelection)

{
  int iVar1;
  MoveMode MVar2;
  QRectF *_t1;
  ulong uVar3;
  QWidgetTextControlPrivate *pQVar4;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControl *q;
  QTextCursor differenceSelection;
  QRectF *in_stack_fffffffffffffec8;
  QRectF *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  QWidgetTextControlPrivate *in_stack_fffffffffffffee8;
  undefined1 local_d0 [16];
  QTextCursor *in_stack_ffffffffffffff40;
  QWidgetTextControl *in_stack_ffffffffffffff48;
  QRectF local_b0 [2];
  undefined1 local_70 [32];
  QRectF local_50 [2];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _t1 = (QRectF *)q_func(in_RDI);
  uVar3 = QTextCursor::hasSelection();
  if (((uVar3 & 1) != 0) && (uVar3 = QTextCursor::hasSelection(), (uVar3 & 1) != 0)) {
    in_stack_fffffffffffffee8 = (QWidgetTextControlPrivate *)QTextCursor::currentFrame();
    pQVar4 = (QWidgetTextControlPrivate *)QTextCursor::currentFrame();
    if ((in_stack_fffffffffffffee8 == pQVar4) &&
       ((uVar3 = QTextCursor::hasComplexSelection(), (uVar3 & 1) == 0 &&
        (uVar3 = QTextCursor::hasComplexSelection(), (uVar3 & 1) == 0)))) {
      in_stack_fffffffffffffee4 = QTextCursor::anchor();
      iVar1 = QTextCursor::anchor();
      if (in_stack_fffffffffffffee4 == iVar1) {
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::QTextCursor((QTextCursor *)&local_10,in_RDI->doc);
        MVar2 = QTextCursor::position();
        QTextCursor::setPosition((int)&local_10,MVar2);
        MVar2 = QTextCursor::position();
        QTextCursor::setPosition((int)&local_10,MVar2);
        QWidgetTextControl::selectionRect(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        QWidgetTextControl::updateRequest
                  ((QWidgetTextControl *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        QTextCursor::~QTextCursor((QTextCursor *)&local_10);
        goto LAB_0070fd6b;
      }
    }
  }
  uVar3 = QTextCursor::isNull();
  if ((uVar3 & 1) == 0) {
    in_stack_fffffffffffffed0 = _t1;
    QWidgetTextControl::selectionRect(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    cursorRectPlusUnicodeDirectionMarkers
              (in_stack_fffffffffffffee8,
               (QTextCursor *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    QRectF::operator|(local_50,(QRectF *)local_70);
    QWidgetTextControl::updateRequest
              ((QWidgetTextControl *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  QWidgetTextControl::selectionRect
            ((QWidgetTextControl *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  cursorRectPlusUnicodeDirectionMarkers
            (in_stack_fffffffffffffee8,
             (QTextCursor *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  QRectF::operator|(local_b0,(QRectF *)local_d0);
  QWidgetTextControl::updateRequest((QWidgetTextControl *)in_stack_fffffffffffffed0,_t1);
LAB_0070fd6b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::repaintOldAndNewSelection(const QTextCursor &oldSelection)
{
    Q_Q(QWidgetTextControl);
    if (cursor.hasSelection()
        && oldSelection.hasSelection()
        && cursor.currentFrame() == oldSelection.currentFrame()
        && !cursor.hasComplexSelection()
        && !oldSelection.hasComplexSelection()
        && cursor.anchor() == oldSelection.anchor()
        ) {
        QTextCursor differenceSelection(doc);
        differenceSelection.setPosition(oldSelection.position());
        differenceSelection.setPosition(cursor.position(), QTextCursor::KeepAnchor);
        emit q->updateRequest(q->selectionRect(differenceSelection));
    } else {
        if (!oldSelection.isNull())
            emit q->updateRequest(q->selectionRect(oldSelection) | cursorRectPlusUnicodeDirectionMarkers(oldSelection));
        emit q->updateRequest(q->selectionRect() | cursorRectPlusUnicodeDirectionMarkers(cursor));
    }
}